

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.hpp
# Opt level: O0

void __thiscall schema::ColumnBase::~ColumnBase(ColumnBase *this)

{
  ColumnBase *in_RDI;
  
  ~ColumnBase(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~ColumnBase() = default;